

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnBrTableTarget(SharedValidator *this,Location *loc,Var *depth)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Var *depth_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  pcVar1 = (char *)0x0;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  pcVar1 = Var::index(depth,pcVar1,__c);
  rhs = TypeChecker::OnBrTableTarget(&this->typechecker_,(Index)pcVar1);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnBrTableTarget(const Location& loc, Var depth) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= typechecker_.OnBrTableTarget(depth.index());
  return result;
}